

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.cc
# Opt level: O0

void __thiscall HandleTpl::restoreXml(HandleTpl *this,Element *el,AddrSpaceManager *manage)

{
  reference ppEVar1;
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_> local_30;
  const_iterator iter;
  List *list;
  AddrSpaceManager *manage_local;
  Element *el_local;
  HandleTpl *this_local;
  
  iter._M_current = (Element **)Element::getChildren(el);
  __gnu_cxx::
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
  __normal_iterator(&local_30);
  local_30._M_current =
       (Element **)std::vector<Element_*,_std::allocator<Element_*>_>::begin(iter._M_current);
  ppEVar1 = __gnu_cxx::
            __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
            ::operator*(&local_30);
  ConstTpl::restoreXml(&this->space,*ppEVar1,manage);
  __gnu_cxx::
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
  operator++(&local_30);
  ppEVar1 = __gnu_cxx::
            __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
            ::operator*(&local_30);
  ConstTpl::restoreXml(&this->size,*ppEVar1,manage);
  __gnu_cxx::
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
  operator++(&local_30);
  ppEVar1 = __gnu_cxx::
            __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
            ::operator*(&local_30);
  ConstTpl::restoreXml(&this->ptrspace,*ppEVar1,manage);
  __gnu_cxx::
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
  operator++(&local_30);
  ppEVar1 = __gnu_cxx::
            __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
            ::operator*(&local_30);
  ConstTpl::restoreXml(&this->ptroffset,*ppEVar1,manage);
  __gnu_cxx::
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
  operator++(&local_30);
  ppEVar1 = __gnu_cxx::
            __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
            ::operator*(&local_30);
  ConstTpl::restoreXml(&this->ptrsize,*ppEVar1,manage);
  __gnu_cxx::
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
  operator++(&local_30);
  ppEVar1 = __gnu_cxx::
            __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
            ::operator*(&local_30);
  ConstTpl::restoreXml(&this->temp_space,*ppEVar1,manage);
  __gnu_cxx::
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
  operator++(&local_30);
  ppEVar1 = __gnu_cxx::
            __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
            ::operator*(&local_30);
  ConstTpl::restoreXml(&this->temp_offset,*ppEVar1,manage);
  return;
}

Assistant:

void HandleTpl::restoreXml(const Element *el,const AddrSpaceManager *manage)

{
  const List &list(el->getChildren());
  List::const_iterator iter;
  iter = list.begin();
  space.restoreXml(*iter,manage);
  ++iter;
  size.restoreXml(*iter,manage);
  ++iter;
  ptrspace.restoreXml(*iter,manage);
  ++iter;
  ptroffset.restoreXml(*iter,manage);
  ++iter;
  ptrsize.restoreXml(*iter,manage);
  ++iter;
  temp_space.restoreXml(*iter,manage);
  ++iter;
  temp_offset.restoreXml(*iter,manage);
}